

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O0

bool __thiscall google::protobuf::internal::ValidateEnum(internal *this,int value,uint32_t *data)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  undefined4 in_register_00000034;
  undefined4 *puVar4;
  int iVar5;
  uint32_t *data_local;
  int value_local;
  int32_t sample;
  size_t pos;
  uint16_t num_ordered;
  uint16_t length_bitmap;
  uint64_t adjusted;
  uint16_t length_seq;
  int16_t min_seq;
  bool local_9;
  
  puVar4 = (undefined4 *)CONCAT44(in_register_00000034,value);
  iVar5 = (int)this;
  uVar1 = (ushort)((uint)*puVar4 >> 0x10);
  uVar2 = (long)iVar5 - (long)(short)*puVar4;
  if (uVar2 < uVar1) {
    local_9 = true;
  }
  else {
    uVar2 = uVar2 - uVar1;
    if (uVar2 < (ushort)puVar4[1]) {
      local_9 = ((uint)puVar4[(uVar2 >> 5) + 2] >> ((byte)uVar2 & 0x1f) & 1) == 1;
    }
    else {
      for (_value_local = 0; _value_local < (ushort)((uint)puVar4[1] >> 0x10);
          _value_local = _value_local * 2 + (long)iVar3) {
        if (puVar4[(long)(int)((puVar4[1] & 0xffff) / 0x20 + 2) + _value_local] == iVar5) {
          return true;
        }
        iVar3 = 2;
        if (iVar5 < (int)puVar4[(long)(int)((puVar4[1] & 0xffff) / 0x20 + 2) + _value_local]) {
          iVar3 = 1;
        }
      }
      local_9 = false;
    }
  }
  return local_9;
}

Assistant:

bool ValidateEnum(int value, const uint32_t* data) {
  return ValidateEnumInlined(value, data);
}